

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_3_4::Xdr::skip<Imf_3_4::CharPtrIO,char_const*>(char **in,int n)

{
  bool bVar1;
  int in_ESI;
  char **in_RDI;
  char c [1024];
  char acStack_418 [1036];
  int local_c;
  char **local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  while( true ) {
    if (local_c < 0x400) {
      if (0 < local_c) {
        CharPtrIO::readChars(local_8,acStack_418,local_c);
      }
      return;
    }
    bVar1 = CharPtrIO::readChars(local_8,acStack_418,0x400);
    if (!bVar1) break;
    local_c = local_c + -0x400;
  }
  return;
}

Assistant:

void
skip (T& in, int n) // skip n padding bytes
{
    char c[1024];

    while (n >= (int) sizeof (c))
    {
        if (!S::readChars (in, c, sizeof (c))) return;

        n -= sizeof (c);
    }

    if (n >= 1) S::readChars (in, c, n);
}